

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCSI.cpp
# Opt level: O0

void __thiscall SCSI::Bus::set_activity_observer(Bus *this,Observer *observer)

{
  Observer *pOVar1;
  allocator<char> local_39;
  string local_38 [32];
  Observer *local_18;
  Observer *observer_local;
  Bus *this_local;
  
  this->activity_observer_ = observer;
  pOVar1 = this->activity_observer_;
  local_18 = observer;
  observer_local = (Observer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"SCSI",&local_39);
  (*pOVar1->_vptr_Observer[2])(pOVar1,local_38,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void Bus::set_activity_observer(Activity::Observer *observer) {
	activity_observer_ = observer;
	activity_observer_->register_led("SCSI");
}